

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O0

shared_ptr<const_pstore::repo::compilation> __thiscall
pstore::repo::compilation::load
          (compilation *this,database *db,extent<pstore::repo::compilation> *location)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  error_code eVar4;
  shared_ptr<const_pstore::repo::compilation> sVar5;
  error_code erc;
  error_code erc_00;
  extent<pstore::repo::compilation> *location_local;
  database *db_local;
  shared_ptr<const_pstore::repo::compilation> *t;
  
  database::getro<pstore::repo::compilation,void>
            ((database *)this,(extent<pstore::repo::compilation> *)db);
  peVar2 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = std::operator!=(&peVar2->signature_,&compilation_signature_);
  if (bVar1) {
    eVar4 = make_error_code(bad_compilation_record);
    erc._M_cat = eVar4._M_cat;
    erc._0_8_ = erc._M_cat;
    raise_error_code<std::error_code>((pstore *)(ulong)(uint)eVar4._M_value,erc);
  }
  peVar2 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  sVar3 = size_bytes(peVar2);
  if (sVar3 == location->size) {
    sVar5.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar5.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (shared_ptr<const_pstore::repo::compilation>)
           sVar5.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>;
  }
  eVar4 = make_error_code(bad_compilation_record);
  erc_00._M_cat = eVar4._M_cat;
  erc_00._0_8_ = erc_00._M_cat;
  raise_error_code<std::error_code>((pstore *)(ulong)(uint)eVar4._M_value,erc_00);
}

Assistant:

auto compilation::load (pstore::database const & db, pstore::extent<compilation> const & location)
    -> std::shared_ptr<compilation const> {
    std::shared_ptr<compilation const> t = db.getro (location);
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (t->signature_ != compilation_signature_) {
        raise_error_code (make_error_code (error_code::bad_compilation_record));
    }
#endif
    if (t->size_bytes () != location.size) {
        raise_error_code (make_error_code (error_code::bad_compilation_record));
    }
    return t;
}